

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_ipclisten.c
# Opt level: O0

void ipc_listener_doaccept(ipc_listener *l)

{
  int *piVar1;
  nni_ipc_conn *local_30;
  nni_ipc_conn *c;
  int local_20;
  int rv;
  int fd;
  int newfd;
  nni_aio *aio;
  ipc_listener *l_local;
  
  aio = (nni_aio *)l;
  while( true ) {
    while( true ) {
      while( true ) {
        _fd = (nni_aio *)nni_list_first((nni_list *)(aio->a_iov + 6));
        if (_fd == (nni_aio *)0x0) {
          return;
        }
        local_20 = nni_posix_pfd_fd((nni_posix_pfd *)&(aio->a_task).task_mtx);
        rv = accept(local_20,(sockaddr *)0x0,(socklen_t *)0x0);
        if (rv < 0) break;
        c._4_4_ = nni_posix_ipc_alloc(&local_30,
                                      (nni_sockaddr *)((long)&(aio->a_task).task_cv.cv + 0x10),
                                      (nni_ipc_dialer *)0x0,rv);
        if (c._4_4_ == NNG_OK) {
          nni_aio_list_remove(_fd);
          nni_aio_set_output(_fd,0,local_30);
          nni_aio_finish(_fd,NNG_OK,0);
        }
        else {
          close(rv);
          nni_aio_list_remove(_fd);
          nni_aio_finish_error(_fd,c._4_4_);
        }
      }
      piVar1 = __errno_location();
      if (*piVar1 == 0xb) break;
      if (1 < *piVar1 - 0x67U) {
        piVar1 = __errno_location();
        c._4_4_ = nni_plat_errno(*piVar1);
        if (c._4_4_ == NNG_OK) {
          nni_panic("%s: %d: assert err: %s",
                    "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/posix/posix_ipclisten.c"
                    ,0x81,"rv != 0");
        }
        nni_aio_list_remove(_fd);
        nni_aio_finish_error(_fd,c._4_4_);
      }
    }
    c._4_4_ = nni_posix_pfd_arm((nni_posix_pfd *)&(aio->a_task).task_mtx,1);
    if (c._4_4_ == NNG_OK) break;
    nni_aio_list_remove(_fd);
    nni_aio_finish_error(_fd,c._4_4_);
  }
  return;
}

Assistant:

static void
ipc_listener_doaccept(ipc_listener *l)
{
	nni_aio *aio;

	while ((aio = nni_list_first(&l->acceptq)) != NULL) {
		int           newfd;
		int           fd;
		int           rv;
		nni_ipc_conn *c;

		fd = nni_posix_pfd_fd(&l->pfd);

#ifdef NNG_USE_ACCEPT4
		newfd = accept4(fd, NULL, NULL, SOCK_CLOEXEC);
		if ((newfd < 0) && ((errno == ENOSYS) || (errno == ENOTSUP))) {
			newfd = accept(fd, NULL, NULL);
		}
#else
		newfd = accept(fd, NULL, NULL);
#endif
		if (newfd < 0) {
			switch (errno) {
			case EAGAIN:
#ifdef EWOULDBLOCK
#if EWOULDBLOCK != EAGAIN
			case EWOULDBLOCK:
#endif
#endif
				rv = nni_posix_pfd_arm(&l->pfd, NNI_POLL_IN);
				if (rv != 0) {
					nni_aio_list_remove(aio);
					nni_aio_finish_error(aio, rv);
					continue;
				}
				// Come back later...
				return;
			case ECONNABORTED:
			case ECONNRESET:
				// Eat them, they aren't interesting.
				continue;
			default:
				// Error this one, but keep moving to the next.
				rv = nni_plat_errno(errno);
				NNI_ASSERT(rv != 0);
				nni_aio_list_remove(aio);
				nni_aio_finish_error(aio, rv);
				continue;
			}
		}

		if ((rv = nni_posix_ipc_alloc(&c, &l->sa, NULL, newfd)) != 0) {
			(void) close(newfd);
			nni_aio_list_remove(aio);
			nni_aio_finish_error(aio, rv);
			continue;
		}

		nni_aio_list_remove(aio);
		nni_aio_set_output(aio, 0, c);
		nni_aio_finish(aio, 0, 0);
	}
}